

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall cmake::SetDirectoriesFromFile(cmake *this,char *arg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  cmState *this_00;
  bool bVar3;
  bool bVar4;
  int iVar5;
  char *__s;
  size_t sVar6;
  bool collapse;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 collapse_00;
  string *this_01;
  string full;
  string cwd;
  string listFile;
  string listPath;
  string cachePath;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  local_70._M_string_length = 0;
  local_70.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_d0,arg,(allocator *)&local_b0);
  bVar3 = cmsys::SystemTools::FileIsDirectory(&local_d0);
  paVar1 = &local_d0.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_b0,arg,(allocator *)&local_90);
    cmsys::SystemTools::CollapseFullPath(&local_d0,&local_b0);
    paVar2 = &local_b0.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d0);
    local_b0._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_b0);
    local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_90,local_d0._M_dataplus._M_p,
               local_d0._M_dataplus._M_p + local_d0._M_string_length);
    std::__cxx11::string::append((char *)&local_90);
    bVar3 = cmsys::SystemTools::FileExists(local_b0._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&local_50);
    }
    bVar3 = cmsys::SystemTools::FileExists(local_90._M_dataplus._M_p);
    if (bVar3) {
      std::__cxx11::string::_M_assign((string *)&local_70);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    bVar3 = cmsys::SystemTools::FileExists(arg);
    if (bVar3) {
      std::__cxx11::string::string((string *)&local_b0,arg,(allocator *)&local_90);
      cmsys::SystemTools::CollapseFullPath(&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenameName(&local_b0,&local_d0);
      cmsys::SystemTools::LowerCase(&local_90,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar5 == 0) {
        cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
        this_01 = &local_50;
LAB_0032ca73:
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar5 == 0) {
          cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
          this_01 = &local_70;
          goto LAB_0032ca73;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      bVar3 = true;
    }
    else {
      std::__cxx11::string::string((string *)&local_b0,arg,(allocator *)&local_90);
      cmsys::SystemTools::CollapseFullPath(&local_d0,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::GetFilenameName(&local_b0,&local_d0);
      cmsys::SystemTools::LowerCase(&local_90,&local_b0);
      std::__cxx11::string::operator=((string *)&local_b0,(string *)&local_90);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
      }
      iVar5 = std::__cxx11::string::compare((char *)&local_b0);
      if (iVar5 == 0) {
LAB_0032c9f3:
        cmsys::SystemTools::GetFilenamePath(&local_90,&local_d0);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        bVar3 = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)&local_b0);
        if (iVar5 == 0) goto LAB_0032c9f3;
        std::__cxx11::string::_M_assign((string *)&local_70);
        bVar3 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != paVar1) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
  }
  if (local_50._M_string_length == 0) {
LAB_0032cb87:
    if (local_70._M_string_length == 0) {
      std::__cxx11::string::string((string *)&local_b0,arg,(allocator *)&local_90);
      cmsys::SystemTools::CollapseFullPath(&local_d0,&local_b0);
      collapse_00 = extraout_DL;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        collapse_00 = extraout_DL_00;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_b0,(SystemTools *)0x1,(bool)collapse_00);
      cmState::SetSourceDirectory(this->State,&local_d0);
      cmState::SetBinaryDirectory(this->State,&local_b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      cmState::SetSourceDirectory(this->State,&local_70);
      if (bVar3) {
        cmState::SetBinaryDirectory(this->State,&local_70);
        goto LAB_0032cc7c;
      }
      cmsys::SystemTools::GetCurrentWorkingDirectory_abi_cxx11_
                (&local_d0,(SystemTools *)0x1,collapse);
      cmState::SetBinaryDirectory(this->State,&local_d0);
    }
  }
  else {
    bVar4 = cmCacheManager::LoadCache(this->CacheManager,&local_50);
    if (!bVar4) goto LAB_0032cb87;
    this_00 = this->State;
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"CMAKE_HOME_DIRECTORY","");
    __s = cmState::GetCacheEntryValue(this_00,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (__s == (char *)0x0) goto LAB_0032cb87;
    cmState::SetBinaryDirectory(this->State,&local_50);
    local_d0._M_dataplus._M_p = (pointer)paVar1;
    sVar6 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,__s,__s + sVar6);
    cmState::SetSourceDirectory(this->State,&local_d0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
LAB_0032cc7c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT71(local_70.field_2._M_allocated_capacity._1_7_,
                             local_70.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void cmake::SetDirectoriesFromFile(const char* arg)
{
  // Check if the argument refers to a CMakeCache.txt or
  // CMakeLists.txt file.
  std::string listPath;
  std::string cachePath;
  bool argIsFile = false;
  if(cmSystemTools::FileIsDirectory(arg))
    {
    std::string path = cmSystemTools::CollapseFullPath(arg);
    cmSystemTools::ConvertToUnixSlashes(path);
    std::string cacheFile = path;
    cacheFile += "/CMakeCache.txt";
    std::string listFile = path;
    listFile += "/CMakeLists.txt";
    if(cmSystemTools::FileExists(cacheFile.c_str()))
      {
      cachePath = path;
      }
    if(cmSystemTools::FileExists(listFile.c_str()))
      {
      listPath = path;
      }
    }
  else if(cmSystemTools::FileExists(arg))
    {
    argIsFile = true;
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if(name == "cmakecache.txt")
      {
      cachePath = cmSystemTools::GetFilenamePath(fullPath);
      }
    else if(name == "cmakelists.txt")
      {
      listPath = cmSystemTools::GetFilenamePath(fullPath);
      }
    }
  else
    {
    // Specified file or directory does not exist.  Try to set things
    // up to produce a meaningful error message.
    std::string fullPath = cmSystemTools::CollapseFullPath(arg);
    std::string name = cmSystemTools::GetFilenameName(fullPath);
    name = cmSystemTools::LowerCase(name);
    if(name == "cmakecache.txt" || name == "cmakelists.txt")
      {
      argIsFile = true;
      listPath = cmSystemTools::GetFilenamePath(fullPath);
      }
    else
      {
      listPath = fullPath;
      }
    }

  // If there is a CMakeCache.txt file, use its settings.
  if(!cachePath.empty())
    {
    if(this->LoadCache(cachePath))
      {
      const char* existingValue =
          this->State->GetCacheEntryValue("CMAKE_HOME_DIRECTORY");
      if (existingValue)
        {
        this->SetHomeOutputDirectory(cachePath);
        this->SetHomeDirectory(existingValue);
        return;
        }
      }
    }

  // If there is a CMakeLists.txt file, use it as the source tree.
  if(!listPath.empty())
    {
    this->SetHomeDirectory(listPath);

    if(argIsFile)
      {
      // Source CMakeLists.txt file given.  It was probably dropped
      // onto the executable in a GUI.  Default to an in-source build.
      this->SetHomeOutputDirectory(listPath);
      }
    else
      {
      // Source directory given on command line.  Use current working
      // directory as build tree.
      std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
      this->SetHomeOutputDirectory(cwd);
      }
    return;
    }

  // We didn't find a CMakeLists.txt or CMakeCache.txt file from the
  // argument.  Assume it is the path to the source tree, and use the
  // current working directory as the build tree.
  std::string full = cmSystemTools::CollapseFullPath(arg);
  std::string cwd = cmSystemTools::GetCurrentWorkingDirectory();
  this->SetHomeDirectory(full);
  this->SetHomeOutputDirectory(cwd);
}